

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O0

bool __thiscall
kj::anon_unknown_30::SocketAddress::operator<(SocketAddress *this,SocketAddress *other)

{
  int iVar1;
  SocketAddress *other_local;
  SocketAddress *this_local;
  
  if ((this->wildcard & 1U) < (other->wildcard & 1U)) {
    this_local._7_1_ = true;
  }
  else if ((other->wildcard & 1U) < (this->wildcard & 1U)) {
    this_local._7_1_ = false;
  }
  else if (this->addrlen < other->addrlen) {
    this_local._7_1_ = true;
  }
  else if (other->addrlen < this->addrlen) {
    this_local._7_1_ = false;
  }
  else {
    iVar1 = memcmp(&this->addr,&other->addr,(ulong)this->addrlen);
    this_local._7_1_ = iVar1 < 0;
  }
  return this_local._7_1_;
}

Assistant:

bool operator<(const SocketAddress& other) const {
    // So we can use std::set<SocketAddress>...  see DNS lookup code.

    if (wildcard < other.wildcard) return true;
    if (wildcard > other.wildcard) return false;

    if (addrlen < other.addrlen) return true;
    if (addrlen > other.addrlen) return false;

    return memcmp(&addr.generic, &other.addr.generic, addrlen) < 0;
  }